

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O0

void llvm::llvm_unreachable_internal(char *msg,char *file,uint line)

{
  raw_ostream *prVar1;
  uint line_local;
  char *file_local;
  char *msg_local;
  
  if (msg != (char *)0x0) {
    prVar1 = dbgs();
    prVar1 = raw_ostream::operator<<(prVar1,msg);
    raw_ostream::operator<<(prVar1,"\n");
  }
  prVar1 = dbgs();
  raw_ostream::operator<<(prVar1,"UNREACHABLE executed");
  if (file != (char *)0x0) {
    prVar1 = dbgs();
    prVar1 = raw_ostream::operator<<(prVar1," at ");
    prVar1 = raw_ostream::operator<<(prVar1,file);
    prVar1 = raw_ostream::operator<<(prVar1,":");
    raw_ostream::operator<<(prVar1,line);
  }
  prVar1 = dbgs();
  raw_ostream::operator<<(prVar1,"!\n");
  abort();
}

Assistant:

void llvm::llvm_unreachable_internal(const char *msg, const char *file,
                                     unsigned line) {
  // This code intentionally doesn't call the ErrorHandler callback, because
  // llvm_unreachable is intended to be used to indicate "impossible"
  // situations, and not legitimate runtime errors.
  if (msg)
    dbgs() << msg << "\n";
  dbgs() << "UNREACHABLE executed";
  if (file)
    dbgs() << " at " << file << ":" << line;
  dbgs() << "!\n";
  abort();
#ifdef LLVM_BUILTIN_UNREACHABLE
  // Windows systems and possibly others don't declare abort() to be noreturn,
  // so use the unreachable builtin to avoid a Clang self-host warning.
  LLVM_BUILTIN_UNREACHABLE;
#endif
}